

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

int base64_encode(void *in_buf,uint in_size,char *out_buf,uint out_size,BASE64_OPTIONS *options)

{
  uint uVar1;
  uint uVar2;
  uint in_ECX;
  uint uVar3;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  BASE64_OPTIONS *in_R8;
  uint v;
  uint out_off;
  uint in_off;
  uint out_size_needed;
  char *out;
  uint8_t *in;
  char table [64];
  uint local_94;
  uint local_90;
  uint local_8c;
  undefined1 local_78 [62];
  char local_3a;
  char local_39;
  BASE64_OPTIONS *local_30;
  uint local_24;
  uint local_14;
  uint local_4;
  
  local_90 = 0;
  local_94 = 0;
  local_30 = in_R8;
  if (in_R8 == (BASE64_OPTIONS *)0x0) {
    local_30 = &base64_def_options;
  }
  local_8c = ((in_ESI + 2) / 3) * 4;
  if ((local_30->pad == '\0') && (uVar1 = in_ESI % 3, uVar1 != 0)) {
    if (uVar1 == 1) {
      local_8c = local_8c - 2;
    }
    else if (uVar1 == 2) {
      local_8c = local_8c - 1;
    }
  }
  if (in_RDX == 0) {
    local_4 = local_8c + 1;
  }
  else if (in_ECX < local_8c) {
    local_4 = 0xffffff97;
  }
  else {
    local_24 = in_ECX;
    local_14 = in_ESI;
    memcpy(local_78,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789",0x3e);
    local_3a = local_30->ch62;
    local_39 = local_30->ch63;
    while (local_90 + 3 <= local_14) {
      uVar1 = (uint)*(byte *)(in_RDI + (ulong)local_90) << 0x10;
      uVar3 = local_90 + 2;
      uVar2 = (uint)*(byte *)(in_RDI + (ulong)(local_90 + 1)) << 8 | uVar1;
      local_90 = local_90 + 3;
      uVar3 = (uint)*(byte *)(in_RDI + (ulong)uVar3);
      *(undefined1 *)(in_RDX + (ulong)local_94) = local_78[(int)(uVar1 >> 0x12)];
      *(undefined1 *)(in_RDX + (ulong)(local_94 + 1)) = local_78[(int)((uVar2 & 0x3f000) >> 0xc)];
      uVar1 = local_94 + 3;
      *(undefined1 *)(in_RDX + (ulong)(local_94 + 2)) = local_78[(int)((uVar3 | uVar2) >> 6 & 0x3f)]
      ;
      local_94 = local_94 + 4;
      *(undefined1 *)(in_RDX + (ulong)uVar1) = local_78[(int)(uVar3 & 0x3f)];
    }
    if (local_90 + 1 == local_14) {
      uVar1 = (uint)*(byte *)(in_RDI + (ulong)local_90) << 0x10;
      *(undefined1 *)(in_RDX + (ulong)local_94) = local_78[(int)(uVar1 >> 0x12)];
      *(undefined1 *)(in_RDX + (ulong)(local_94 + 1)) = local_78[(int)(uVar1 >> 0xc & 0x3f)];
      uVar1 = local_94 + 2;
      if (local_30->pad != '\0') {
        *(char *)(in_RDX + (ulong)(local_94 + 2)) = local_30->pad;
        *(char *)(in_RDX + (ulong)(local_94 + 3)) = local_30->pad;
        uVar1 = local_94 + 4;
      }
    }
    else {
      uVar1 = local_94;
      if (local_90 + 2 == local_14) {
        uVar1 = (uint)*(byte *)(in_RDI + (ulong)local_90) << 0x10;
        uVar2 = (uint)*(byte *)(in_RDI + (ulong)(local_90 + 1)) << 8;
        *(undefined1 *)(in_RDX + (ulong)local_94) = local_78[(int)(uVar1 >> 0x12)];
        *(undefined1 *)(in_RDX + (ulong)(local_94 + 1)) =
             local_78[(int)((uVar2 | uVar1) >> 0xc & 0x3f)];
        *(undefined1 *)(in_RDX + (ulong)(local_94 + 2)) = local_78[(int)((uVar2 & 0xfc0) >> 6)];
        uVar1 = local_94 + 3;
        if (local_30->pad != '\0') {
          *(char *)(in_RDX + (ulong)(local_94 + 3)) = local_30->pad;
          uVar1 = local_94 + 4;
        }
      }
    }
    local_94 = uVar1;
    if (local_94 < local_24) {
      *(undefined1 *)(in_RDX + (ulong)local_94) = 0;
    }
    local_4 = local_94;
  }
  return local_4;
}

Assistant:

int
base64_encode(const void* in_buf, unsigned in_size,
              char* out_buf, unsigned out_size,
              const BASE64_OPTIONS* options)
{
    char table[64];
    const uint8_t* in = (const uint8_t*) in_buf;
    char* out = out_buf;
    unsigned out_size_needed;
    unsigned in_off = 0;
    unsigned out_off = 0;
    unsigned v;

    if(options == NULL)
        options = &base64_def_options;

    /* Every three bytes are encoded into 4 characters of output.
     * Finally add +1 for zero terminator. */
    out_size_needed = ((in_size + 2) / 3) * 4;

    /* With padding disabled, we may need little less. */
    if(!options->pad) {
        switch(in_size % 3) {
            case 0: break;
            case 1: out_size_needed -= 2; break;
            case 2: out_size_needed -= 1; break;
        }
    }

    if(out_buf == NULL) {
        /* Recommend caller +1 for zero terminator. */
        return out_size_needed + 1;
    }

    /* Check we have enough space in the output. */
    if(out_size < out_size_needed)
        return -ENOBUFS;

    /* Build table. */
    memcpy(table, base64_table_core, 62);
    table[62] = options->ch62;
    table[63] = options->ch63;

    /* Main loop. We process triples of input bytes at once to avoid branches
     * inside the loop and handle indivisible tail below specially. */
    while(in_off + 3 <= in_size) {
        v  = ((unsigned) in[in_off++]) << 16;
        v |= ((unsigned) in[in_off++]) <<  8;
        v |= ((unsigned) in[in_off++]);

        out[out_off++] = table[(uint8_t)(v >> 18) & 0x3f];
        out[out_off++] = table[(uint8_t)(v >> 12) & 0x3f];
        out[out_off++] = table[(uint8_t)(v >>  6) & 0x3f];
        out[out_off++] = table[(uint8_t)(v      ) & 0x3f];
    }

    /* Process a tail of one or two remaining input bytes.
     * Note one-byte tail corresponds to two characters in output,
     * and two-byte tail to three characters of output. */
    if(in_off + 1 == in_size) {                     /* One-byte tail. */
        v = ((unsigned) in[in_off++]) << 16;
        out[out_off++] = table[(uint8_t)(v >> 18) & 0x3f];
        out[out_off++] = table[(uint8_t)(v >> 12) & 0x3f];

        /* Add two padding chars. */
        if(options->pad) {
            out[out_off++] = options->pad;
            out[out_off++] = options->pad;
        }
    } else if(in_off + 2 == in_size) {              /* Two-byte tail. */
        v = ((unsigned) in[in_off++]) << 16;
        v |= ((unsigned) in[in_off++]) << 8;
        out[out_off++] = table[(uint8_t)(v >> 18) & 0x3f];
        out[out_off++] = table[(uint8_t)(v >> 12) & 0x3f];
        out[out_off++] = table[(uint8_t)(v >>  6) & 0x3f];

        /* Add one padding char. */
        if(options->pad)
            out[out_off++] = options->pad;
    }

    /* Add terminator. */
    if(out_off < out_size)
        out[out_off] = '\0';

    return out_off;
}